

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

int main(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint32_t h;
  chck_atlas atlas;
  chck_atlas_rect tr;
  uint32_t w;
  uint local_5c;
  undefined1 local_58 [16];
  int local_48;
  int local_44;
  int local_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  uint local_1c;
  
  cVar1 = chck_atlas(local_58);
  if (cVar1 == '\0') {
    __assert_fail("chck_atlas(&atlas)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0xd,"int main(void)");
  }
  if (local_48 != 0) {
    __assert_fail("atlas.count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0xe,"int main(void)");
  }
  iVar2 = chck_atlas_push(local_58,0x140,0x140);
  if (iVar2 == 0) {
    __assert_fail("chck_atlas_push(&atlas, 320, 320)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x10,"int main(void)");
  }
  if (local_48 != 1) {
    __assert_fail("atlas.count == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x11,"int main(void)");
  }
  iVar2 = chck_atlas_pop(local_58);
  if (iVar2 != 0) {
    __assert_fail("chck_atlas_pop(&atlas) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x13,"int main(void)");
  }
  if (local_48 != 0) {
    __assert_fail("atlas.count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x14,"int main(void)");
  }
  iVar2 = chck_atlas_push(local_58,0x140,0x140);
  if (iVar2 != 1) {
    __assert_fail("chck_atlas_push(&atlas, 320, 320) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x16,"int main(void)");
  }
  iVar2 = chck_atlas_push(local_58,0x20,0x20);
  if (iVar2 != 2) {
    __assert_fail("chck_atlas_push(&atlas, 32, 32) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x17,"int main(void)");
  }
  iVar2 = chck_atlas_push(local_58,0x20,0x120);
  if (iVar2 != 3) {
    __assert_fail("chck_atlas_push(&atlas, 32, 288) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x18,"int main(void)");
  }
  if (local_48 != 3) {
    __assert_fail("atlas.count == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x19,"int main(void)");
  }
  if ((local_44 != 0x140) || (local_40 != 0x1b800)) {
    __assert_fail("atlas.longest_edge == 320 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x1a,"int main(void)");
  }
  iVar3 = chck_atlas_pack(local_58,0,0,&local_1c,&local_5c);
  iVar2 = iVar3;
  printf("%ux%u (%u)\n",(ulong)local_1c,(ulong)local_5c);
  if (((local_1c != 0x160) || (local_5c != 0x140)) || (iVar3 != 0x1b800 - local_40)) {
    __assert_fail("w == 352 && h == 320 && free == w * h - atlas.total_area",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x20,"int main(void)");
  }
  lVar4 = chck_atlas_get(local_58,1,&local_38);
  if (lVar4 == 0) {
    __assert_fail("(t = chck_atlas_get(&atlas, 1, &tr))",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x24,"int main(void)");
  }
  auVar6._0_4_ = -(uint)(local_38 == 0);
  auVar6._4_4_ = -(uint)(iStack_34 == 0);
  auVar6._8_4_ = -(uint)(iStack_30 == 0x140);
  auVar6._12_4_ = -(uint)(iStack_2c == 0x140);
  uVar5 = movmskps(iVar2,auVar6);
  uVar5 = uVar5 ^ 0xf;
  if (uVar5 != 0) {
    __assert_fail("tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x25,"int main(void)");
  }
  if (((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
     ((*(int *)(lVar4 + 0x14) != 0x140 || (*(int *)(lVar4 + 0x10) != 0x19000)))) {
    __assert_fail("!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x26,"int main(void)");
  }
  lVar4 = chck_atlas_get(local_58,2,&local_38);
  if (lVar4 == 0) {
    __assert_fail("(t = chck_atlas_get(&atlas, 2, &tr))",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x28,"int main(void)");
  }
  auVar7._0_4_ = -(uint)(local_38 == 0x140);
  auVar7._4_4_ = -(uint)(iStack_34 == 0x120);
  auVar7._8_4_ = -(uint)(iStack_30 == 0x20);
  auVar7._12_4_ = -(uint)(iStack_2c == 0x20);
  uVar5 = movmskps(uVar5,auVar7);
  uVar5 = uVar5 ^ 0xf;
  if (uVar5 == 0) {
    if (((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
       ((*(int *)(lVar4 + 0x14) != 0x20 || (*(int *)(lVar4 + 0x10) != 0x400)))) {
      __assert_fail("!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2a,"int main(void)");
    }
    lVar4 = chck_atlas_get(local_58,3,&local_38);
    if (lVar4 == 0) {
      __assert_fail("(t = chck_atlas_get(&atlas, 3, &tr))",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2c,"int main(void)");
    }
    auVar8._0_4_ = -(uint)(local_38 == 0x140);
    auVar8._4_4_ = -(uint)(iStack_34 == 0);
    auVar8._8_4_ = -(uint)(iStack_30 == 0x20);
    auVar8._12_4_ = -(uint)(iStack_2c == 0x120);
    iVar2 = movmskps(uVar5,auVar8);
    if (iVar2 != 0xf) {
      __assert_fail("tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2d,"int main(void)");
    }
    if ((((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
        (*(int *)(lVar4 + 0x14) != 0x120)) || (*(int *)(lVar4 + 0x10) != 0x2400)) {
      __assert_fail("!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x2e,"int main(void)");
    }
    chck_atlas_release(local_58);
    cVar1 = chck_atlas(local_58);
    if (cVar1 == '\0') {
      __assert_fail("chck_atlas(&atlas)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x36,"int main(void)");
    }
    iVar2 = chck_atlas_push(local_58,0x140,0x140);
    if (iVar2 != 1) {
      __assert_fail("chck_atlas_push(&atlas, 320, 320) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x37,"int main(void)");
    }
    iVar2 = chck_atlas_push(local_58,0x20,0x20);
    if (iVar2 != 2) {
      __assert_fail("chck_atlas_push(&atlas, 32, 32) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x38,"int main(void)");
    }
    iVar2 = chck_atlas_push(local_58,0x20,0x120);
    if (iVar2 != 3) {
      __assert_fail("chck_atlas_push(&atlas, 32, 288) == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x39,"int main(void)");
    }
    if ((local_48 != 3) || (local_40 != 0x1b800)) {
      __assert_fail("atlas.count == 3 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x3a,"int main(void)");
    }
    iVar3 = chck_atlas_pack(local_58,1,0,&local_1c,&local_5c);
    iVar2 = iVar3;
    printf("%ux%u (%u)\n",(ulong)local_1c,(ulong)local_5c);
    if (((local_1c == 0x200) && (local_5c == 0x200)) && (iVar3 == 0x40000 - local_40)) {
      lVar4 = chck_atlas_get(local_58,1,&local_38);
      if (lVar4 == 0) {
        __assert_fail("(t = chck_atlas_get(&atlas, 1, &tr))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x43,"int main(void)");
      }
      auVar9._0_4_ = -(uint)(local_38 == 0);
      auVar9._4_4_ = -(uint)(iStack_34 == 0);
      auVar9._8_4_ = -(uint)(iStack_30 == 0x140);
      auVar9._12_4_ = -(uint)(iStack_2c == 0x140);
      uVar5 = movmskps(iVar2,auVar9);
      uVar5 = uVar5 ^ 0xf;
      if (uVar5 != 0) {
        __assert_fail("tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x44,"int main(void)");
      }
      if ((((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
          (*(int *)(lVar4 + 0x14) != 0x140)) || (*(int *)(lVar4 + 0x10) != 0x19000)) {
        __assert_fail("!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x45,"int main(void)");
      }
      lVar4 = chck_atlas_get(local_58,2,&local_38);
      if (lVar4 == 0) {
        __assert_fail("(t = chck_atlas_get(&atlas, 2, &tr))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x47,"int main(void)");
      }
      auVar10._0_4_ = -(uint)(local_38 == 0x140);
      auVar10._4_4_ = -(uint)(iStack_34 == 0x120);
      auVar10._8_4_ = -(uint)(iStack_30 == 0x20);
      auVar10._12_4_ = -(uint)(iStack_2c == 0x20);
      uVar5 = movmskps(uVar5,auVar10);
      uVar5 = uVar5 ^ 0xf;
      if (uVar5 == 0) {
        if (((*(char *)(lVar4 + 0x18) != '\0') || (*(char *)(lVar4 + 0x19) != '\x01')) ||
           ((*(int *)(lVar4 + 0x14) != 0x20 || (*(int *)(lVar4 + 0x10) != 0x400)))) {
          __assert_fail("!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                        ,0x49,"int main(void)");
        }
        lVar4 = chck_atlas_get(local_58,3,&local_38);
        if (lVar4 == 0) {
          __assert_fail("(t = chck_atlas_get(&atlas, 3, &tr))",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                        ,0x4b,"int main(void)");
        }
        auVar11._0_4_ = -(uint)(local_38 == 0x140);
        auVar11._4_4_ = -(uint)(iStack_34 == 0);
        auVar11._8_4_ = -(uint)(iStack_30 == 0x20);
        auVar11._12_4_ = -(uint)(iStack_2c == 0x120);
        iVar2 = movmskps(uVar5,auVar11);
        if (iVar2 == 0xf) {
          if (((*(char *)(lVar4 + 0x18) == '\0') && (*(char *)(lVar4 + 0x19) == '\x01')) &&
             ((*(int *)(lVar4 + 0x14) == 0x120 && (*(int *)(lVar4 + 0x10) == 0x2400)))) {
            chck_atlas_release(local_58);
            return 0;
          }
          __assert_fail("!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                        ,0x4d,"int main(void)");
        }
        __assert_fail("tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                      ,0x4c,"int main(void)");
      }
      __assert_fail("tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                    ,0x48,"int main(void)");
    }
    __assert_fail("w == 512 && h == 512 && free == w * h - atlas.total_area",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                  ,0x3f,"int main(void)");
  }
  __assert_fail("tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/test.c"
                ,0x29,"int main(void)");
}

Assistant:

int main(void)
{
   /* TEST: atlas packing */
   {
      struct chck_atlas atlas;
      assert(chck_atlas(&atlas));
      assert(atlas.count == 0);

      assert(chck_atlas_push(&atlas, 320, 320));
      assert(atlas.count == 1);

      assert(chck_atlas_pop(&atlas) == 0);
      assert(atlas.count == 0);

      assert(chck_atlas_push(&atlas, 320, 320) == 1);
      assert(chck_atlas_push(&atlas, 32, 32) == 2);
      assert(chck_atlas_push(&atlas, 32, 288) == 3);
      assert(atlas.count == 3);
      assert(atlas.longest_edge == 320 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288);

      uint32_t w, h;
      uint32_t free = chck_atlas_pack(&atlas, false, false, &w, &h);

      printf("%ux%u (%u)\n", w, h, free);
      assert(w == 352 && h == 320 && free == w * h - atlas.total_area);

      struct chck_atlas_rect tr;
      const struct chck_atlas_texture *t;
      assert((t = chck_atlas_get(&atlas, 1, &tr)));
      assert(tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320);
      assert(!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320);

      assert((t = chck_atlas_get(&atlas, 2, &tr)));
      assert(tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32);
      assert(!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32);

      assert((t = chck_atlas_get(&atlas, 3, &tr)));
      assert(tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288);
      assert(!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288);

      chck_atlas_release(&atlas);
   }

   /* TEST: atlas packing (forced pot) */
   {
      struct chck_atlas atlas;
      assert(chck_atlas(&atlas));
      assert(chck_atlas_push(&atlas, 320, 320) == 1);
      assert(chck_atlas_push(&atlas, 32, 32) == 2);
      assert(chck_atlas_push(&atlas, 32, 288) == 3);
      assert(atlas.count == 3 && atlas.total_area == 320 * 320 + 32 * 32 + 32 * 288);

      uint32_t w, h;
      uint32_t free = chck_atlas_pack(&atlas, true, false, &w, &h);
      printf("%ux%u (%u)\n", w, h, free);
      assert(w == 512 && h == 512 && free == w * h - atlas.total_area);

      struct chck_atlas_rect tr;
      const struct chck_atlas_texture *t;
      assert((t = chck_atlas_get(&atlas, 1, &tr)));
      assert(tr.x == 0 && tr.y == 0 && tr.w == 320 && tr.h == 320);
      assert(!t->flipped && t->placed && t->longest_edge == 320 && t->area == 320 * 320);

      assert((t = chck_atlas_get(&atlas, 2, &tr)));
      assert(tr.x == 320 && tr.y == 288 && tr.w == 32 && tr.h == 32);
      assert(!t->flipped && t->placed && t->longest_edge == 32 && t->area == 32 * 32);

      assert((t = chck_atlas_get(&atlas, 3, &tr)));
      assert(tr.x == 320 && tr.y == 0 && tr.w == 32 && tr.h == 288);
      assert(!t->flipped && t->placed && t->longest_edge == 288 && t->area == 32 * 288);

      chck_atlas_release(&atlas);
   }

   return EXIT_SUCCESS;
}